

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64_shift.hpp
# Opt level: O3

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,parameter_type *P)

{
  undefined4 uVar1;
  basic_istream<char,_std::char_traits<char>_> *pbVar2;
  istream *piVar3;
  long lVar4;
  parameter_type P_new;
  delim_c local_3b;
  delim_c local_3a;
  delim_c local_39;
  result_type local_38;
  result_type rStack_30;
  
  local_38 = 0;
  rStack_30 = 0;
  uVar1 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  local_39.c = '(';
  pbVar2 = utility::operator>>(in,&local_39);
  piVar3 = std::istream::_M_extract<unsigned_long>((ulong *)pbVar2);
  local_3a.c = ' ';
  pbVar2 = utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_3a);
  piVar3 = std::istream::_M_extract<unsigned_long>((ulong *)pbVar2);
  local_3b.c = ')';
  utility::operator>>((basic_istream<char,_std::char_traits<char>_> *)piVar3,&local_3b);
  lVar4 = *(long *)(*(long *)in + -0x18);
  if (((byte)in[lVar4 + 0x20] & 5) == 0) {
    P->a = local_38;
    P->b = rStack_30;
    lVar4 = *(long *)(*(long *)in + -0x18);
  }
  *(undefined4 *)(in + lVar4 + 0x18) = uVar1;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
          std::basic_istream<char_t, traits_t> &in, parameter_type &P) {
        parameter_type P_new;
        std::ios_base::fmtflags flags(in.flags());
        in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        in >> utility::delim('(') >> P_new.a >> utility::delim(' ') >> P_new.b >>
            utility::delim(')');
        if (in)
          P = P_new;
        in.flags(flags);
        return in;
      }